

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ip6-addr.c
# Opt level: O0

int run_test_ip6_pton(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  undefined1 local_18 [8];
  in6_addr addr;
  
  iVar1 = uv_inet_pton(10,"::",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"::\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"::%en1",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"::\" \"%en1\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"::%%%%",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"::\" \"%%%%\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"::%en1:1.2.3.4",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"::\" \"%en1:1.2.3.4\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"::1",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"::1\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"::1%en1",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"::1\" \"%en1\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"::1%%%%",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"::1\" \"%%%%\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"::1%en1:1.2.3.4",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"::1\" \"%en1:1.2.3.4\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80::1",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80::1\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80::1%en1",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80::1\" \"%en1\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80::1%%%%",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80::1\" \"%%%%\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80::1%en1:1.2.3.4",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80::1\" \"%en1:1.2.3.4\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80::",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80::\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80::%en1",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80::\" \"%en1\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80::%%%%",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80::\" \"%%%%\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80::%en1:1.2.3.4",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80::\" \"%en1:1.2.3.4\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80::2acf:daff:fedd:342a\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a%en1",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80::2acf:daff:fedd:342a\" \"%en1\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a%%%%",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80::2acf:daff:fedd:342a\" \"%%%%\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a%en1:1.2.3.4",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,
            "0 == uv_inet_pton(AF_INET6, \"fe80::2acf:daff:fedd:342a\" \"%en1:1.2.3.4\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a%en1",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a\" \"%en1\", &addr)")
    ;
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a%%%%",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a\" \"%%%%\", &addr)")
    ;
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a%en1:1.2.3.4",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,
            "0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a\" \"%en1:1.2.3.4\", &addr)"
           );
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:1.2.3.4\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4%en1",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:1.2.3.4\" \"%en1\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4%%%%",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,"0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:1.2.3.4\" \"%%%%\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:1.2.3.4%en1:1.2.3.4",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,
            "0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:1.2.3.4\" \"%en1:1.2.3.4\", &addr)")
    ;
    abort();
  }
  iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,
            "0 == uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255\", &addr)")
    ;
    abort();
  }
  iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255%en1",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,
            "0 == uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255\" \"%en1\", &addr)"
           );
    abort();
  }
  iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255%%%%",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,
            "0 == uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255\" \"%%%%\", &addr)"
           );
    abort();
  }
  iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255%en1:1.2.3.4",local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9a,
            "0 == uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255\" \"%en1:1.2.3.4\", &addr)"
           );
    abort();
  }
  iVar1 = uv_inet_pton(10,":::1",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,"0 != uv_inet_pton(AF_INET6, \":::1\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,":::1%en1",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,"0 != uv_inet_pton(AF_INET6, \":::1\" \"%en1\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,":::1%%%%",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,"0 != uv_inet_pton(AF_INET6, \":::1\" \"%%%%\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,":::1%en1:1.2.3.4",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,"0 != uv_inet_pton(AF_INET6, \":::1\" \"%en1:1.2.3.4\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"abcde::1",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,"0 != uv_inet_pton(AF_INET6, \"abcde::1\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"abcde::1%en1",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,"0 != uv_inet_pton(AF_INET6, \"abcde::1\" \"%en1\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"abcde::1%%%%",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,"0 != uv_inet_pton(AF_INET6, \"abcde::1\" \"%%%%\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"abcde::1%en1:1.2.3.4",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,"0 != uv_inet_pton(AF_INET6, \"abcde::1\" \"%en1:1.2.3.4\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,"0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a:5678\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678%en1",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,
            "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a:5678\" \"%en1\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678%%%%",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,
            "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a:5678\" \"%%%%\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a:5678%en1:1.2.3.4",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,
            "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a:5678\" \"%en1:1.2.3.4\", &addr)"
           );
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,"0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:abcd:1.2.3.4\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4%en1",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,
            "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:abcd:1.2.3.4\" \"%en1\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4%%%%",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,
            "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:abcd:1.2.3.4\" \"%%%%\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:abcd:1.2.3.4%en1:1.2.3.4",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,
            "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:abcd:1.2.3.4\" \"%en1:1.2.3.4\", &addr)"
           );
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,"0 != uv_inet_pton(AF_INET6, \"fe80:0:0:2acf:daff:1.2.3.4.5\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5%en1",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,"0 != uv_inet_pton(AF_INET6, \"fe80:0:0:2acf:daff:1.2.3.4.5\" \"%en1\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5%%%%",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,"0 != uv_inet_pton(AF_INET6, \"fe80:0:0:2acf:daff:1.2.3.4.5\" \"%%%%\", &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(10,"fe80:0:0:2acf:daff:1.2.3.4.5%en1:1.2.3.4",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,
            "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:2acf:daff:1.2.3.4.5\" \"%en1:1.2.3.4\", &addr)")
    ;
    abort();
  }
  iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,
            "0 != uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255\", &addr)"
           );
    abort();
  }
  iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255%en1",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,
            "0 != uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255\" \"%en1\", &addr)"
           );
    abort();
  }
  iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255%%%%",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,
            "0 != uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255\" \"%%%%\", &addr)"
           );
    abort();
  }
  iVar1 = uv_inet_pton(10,"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255%en1:1.2.3.4",local_18);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9b,
            "0 != uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255\" \"%en1:1.2.3.4\", &addr)"
           );
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x9d,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(ip6_pton) {
  struct in6_addr addr;

  GOOD_ADDR_LIST(TEST_GOOD)
  BAD_ADDR_LIST(TEST_BAD)

  MAKE_VALGRIND_HAPPY();
  return 0;
}